

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

Var * __thiscall
kratos::Generator::var(Generator *this,string *var_name,uint32_t width,uint32_t size,bool is_signed)

{
  Var *pVVar1;
  initializer_list<unsigned_int> __l;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  uint32_t local_38;
  allocator_type local_31;
  
  __l._M_len = 1;
  __l._M_array = &local_38;
  local_38 = size;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,__l,&local_31);
  pVVar1 = var(this,var_name,width,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50,
               is_signed);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_50);
  return pVVar1;
}

Assistant:

Var &Generator::var(const std::string &var_name, uint32_t width, uint32_t size, bool is_signed) {
    const auto &lst = std::vector<uint32_t>{size};
    return var(var_name, width, lst, is_signed);
}